

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_receive(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,
                       size_t bufferCount)

{
  uint16_t uVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t in_RCX;
  iovec *in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  int recvLength;
  sockaddr_in sin;
  msghdr msgHdr;
  undefined1 local_68 [2];
  uint16_t local_66;
  undefined4 local_64;
  msghdr local_58;
  size_t local_20;
  iovec *local_18;
  undefined4 *local_10;
  int local_8;
  int local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(&local_58,0,0x38);
  if (local_10 != (undefined4 *)0x0) {
    local_58.msg_name = local_68;
    local_58.msg_namelen = 0x10;
  }
  local_58.msg_iov = local_18;
  local_58.msg_iovlen = local_20;
  sVar2 = recvmsg(local_8,&local_58,0x4000);
  local_4 = (int)sVar2;
  if (local_4 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else if ((local_58.msg_flags & 0x20U) == 0) {
    if (local_10 != (undefined4 *)0x0) {
      *local_10 = local_64;
      uVar1 = ntohs(local_66);
      *(uint16_t *)(local_10 + 1) = uVar1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
enet_socket_receive (ENetSocket socket,
                     ENetAddress * address,
                     ENetBuffer * buffers,
                     size_t bufferCount)
{
    struct msghdr msgHdr;
    struct sockaddr_in sin;
    int recvLength;

    memset (& msgHdr, 0, sizeof (struct msghdr));

    if (address != NULL)
    {
        msgHdr.msg_name = & sin;
        msgHdr.msg_namelen = sizeof (struct sockaddr_in);
    }

    msgHdr.msg_iov = (struct iovec *) buffers;
    msgHdr.msg_iovlen = bufferCount;

    recvLength = recvmsg (socket, & msgHdr, MSG_NOSIGNAL);

    if (recvLength == -1)
    {
       if (errno == EWOULDBLOCK)
         return 0;

       return -1;
    }

#ifdef HAS_MSGHDR_FLAGS
    if (msgHdr.msg_flags & MSG_TRUNC)
      return -1;
#endif

    if (address != NULL)
    {
        address -> host = (enet_uint32) sin.sin_addr.s_addr;
        address -> port = ENET_NET_TO_HOST_16 (sin.sin_port);
    }

    return recvLength;
}